

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char zBuf [100];
  DateTime x;
  _func_void_void_ptr *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  sqlite3_context *in_stack_ffffffffffffff60;
  sqlite3_value **in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  sqlite3_context *in_stack_ffffffffffffff78;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  iVar1 = isDate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                 (DateTime *)in_stack_ffffffffffffff60);
  if (iVar1 == 0) {
    computeYMD((DateTime *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    sqlite3_snprintf(100,&stack0xffffffffffffff48,"%04d-%02d-%02d",(ulong)local_40,(ulong)local_3c,
                     (ulong)local_38);
    sqlite3_result_text(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeYMD(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%04d-%02d-%02d", x.Y, x.M, x.D);
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}